

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationSection.cxx
# Opt level: O0

void __thiscall cmDocumentationSection::Append(cmDocumentationSection *this,char *(*data) [2])

{
  cmDocumentationEntry local_60;
  int local_1c;
  char *(*papcStack_18) [2];
  int i;
  char *(*data_local) [2];
  cmDocumentationSection *this_local;
  
  local_1c = 0;
  papcStack_18 = data;
  data_local = (char *(*) [2])this;
  while (papcStack_18[local_1c][1] != (char *)0x0) {
    cmDocumentationEntry::cmDocumentationEntry
              (&local_60,papcStack_18[local_1c][0],papcStack_18[local_1c][1]);
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
              (&this->Entries,&local_60);
    cmDocumentationEntry::~cmDocumentationEntry(&local_60);
    papcStack_18 = papcStack_18 + 1;
  }
  return;
}

Assistant:

void cmDocumentationSection::Append(const char* data[][2])
{
  int i = 0;
  while (data[i][1]) {
    this->Entries.push_back(cmDocumentationEntry(data[i][0], data[i][1]));
    data += 1;
  }
}